

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReactorCvode.cpp
# Opt level: O0

int __thiscall pele::physics::reactions::ReactorCvode::init(ReactorCvode *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  N_Vector p_Var6;
  void *pvVar7;
  CVODEUserData *pCVar8;
  SUNNonlinearSolver p_Var9;
  SUNMatrix p_Var10;
  SUNLinearSolver p_Var11;
  int in_EDX;
  Real time;
  int flag;
  int neq_tot;
  ParmParse pp;
  ReactorCvode *in_stack_000021a0;
  SUNContext in_stack_fffffffffffff7c8;
  undefined4 in_stack_fffffffffffff7d0;
  int in_stack_fffffffffffff7d4;
  undefined4 in_stack_fffffffffffff7d8;
  int in_stack_fffffffffffff7dc;
  int in_stack_fffffffffffff7e0;
  int in_stack_fffffffffffff7e4;
  sunindextype in_stack_fffffffffffff7e8;
  sunindextype in_stack_fffffffffffff7ec;
  undefined4 in_stack_fffffffffffff7f0;
  undefined4 in_stack_fffffffffffff7f4;
  undefined4 in_stack_fffffffffffff7f8;
  undefined4 in_stack_fffffffffffff7fc;
  undefined4 in_stack_fffffffffffff800;
  undefined4 in_stack_fffffffffffff804;
  undefined4 in_stack_fffffffffffff808;
  undefined4 in_stack_fffffffffffff80c;
  undefined4 in_stack_fffffffffffff810;
  undefined4 in_stack_fffffffffffff814;
  Print *in_stack_fffffffffffff840;
  undefined8 in_stack_fffffffffffff848;
  double *in_stack_fffffffffffff850;
  char *in_stack_fffffffffffff858;
  undefined4 in_stack_fffffffffffff860;
  undefined4 in_stack_fffffffffffff864;
  allocator local_599;
  string local_598 [32];
  undefined8 local_578;
  int local_56c;
  undefined4 local_568;
  int local_564;
  string *in_stack_fffffffffffffb90;
  Real in_stack_fffffffffffffb98;
  Real in_stack_fffffffffffffba0;
  int in_stack_fffffffffffffbac;
  undefined4 in_stack_fffffffffffffbb0;
  int in_stack_fffffffffffffbb4;
  CVODEUserData *in_stack_fffffffffffffbb8;
  ReactorCvode *in_stack_fffffffffffffbc0;
  allocator local_b1;
  string local_b0 [120];
  int local_38;
  int local_34;
  ReactorCvode *local_30;
  int local_24;
  char *local_20;
  char *local_18;
  char *local_10;
  char *local_8;
  
  iVar1 = (int)((ulong)in_stack_fffffffffffff848 >> 0x20);
  local_34 = (int)ctx;
  this->m_reactor_type = local_34;
  local_38 = in_EDX;
  local_30 = this;
  ReactorTypes::check_reactor_type((int)((ulong)in_stack_fffffffffffff7c8 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"ode",&local_b1);
  amrex::ParmParse::ParmParse
            ((ParmParse *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
             (string *)CONCAT44(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8));
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  amrex::ParmParse::query
            ((ParmParse *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860),
             in_stack_fffffffffffff858,(int *)in_stack_fffffffffffff850,iVar1);
  amrex::ParmParse::query
            ((ParmParse *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860),
             in_stack_fffffffffffff858,in_stack_fffffffffffff850,iVar1);
  amrex::ParmParse::query
            ((ParmParse *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860),
             in_stack_fffffffffffff858,in_stack_fffffffffffff850,iVar1);
  amrex::ParmParse::query
            ((ParmParse *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860),
             in_stack_fffffffffffff858,(int *)in_stack_fffffffffffff850,iVar1);
  amrex::ParmParse::query
            ((ParmParse *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860),
             in_stack_fffffffffffff858,(int *)in_stack_fffffffffffff850,iVar1);
  amrex::ParmParse::query
            ((ParmParse *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860),
             in_stack_fffffffffffff858,(int *)in_stack_fffffffffffff850,iVar1);
  amrex::ParmParse::query
            ((ParmParse *)CONCAT44(in_stack_fffffffffffff864,in_stack_fffffffffffff860),
             in_stack_fffffffffffff858,(bool *)in_stack_fffffffffffff850,iVar1);
  checkCvodeOptions(in_stack_000021a0);
  amrex::OutStream();
  amrex::Print::Print((Print *)CONCAT44(in_stack_fffffffffffff804,in_stack_fffffffffffff800),
                      (ostream *)CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8));
  amrex::Print::operator<<
            ((Print *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
             (char (*) [21])in_stack_fffffffffffff7c8);
  amrex::Print::~Print(in_stack_fffffffffffff840);
  if (this->atomic_reductions == 0) {
    amrex::OutStream();
    amrex::Print::Print((Print *)CONCAT44(in_stack_fffffffffffff804,in_stack_fffffffffffff800),
                        (ostream *)CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8));
    amrex::Print::operator<<
              ((Print *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
               (char (*) [24])in_stack_fffffffffffff7c8);
    amrex::Print::~Print(in_stack_fffffffffffff840);
  }
  else {
    amrex::OutStream();
    amrex::Print::Print((Print *)CONCAT44(in_stack_fffffffffffff804,in_stack_fffffffffffff800),
                        (ostream *)CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8));
    amrex::Print::operator<<
              ((Print *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
               (char (*) [27])in_stack_fffffffffffff7c8);
    amrex::Print::~Print(in_stack_fffffffffffff840);
  }
  local_564 = local_38 * 10;
  amrex::OpenMP::get_thread_num();
  amrex::sundials::The_Sundials_Context(0);
  sundials::Context::operator_cast_to__SUNContext_((Context *)0x1c54fd);
  p_Var6 = N_VNew_Serial(in_stack_fffffffffffff7dc,
                         (SUNContext)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0));
  this->y = p_Var6;
  iVar1 = utils::check_flag((void *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                            (char *)CONCAT44(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8),
                            in_stack_fffffffffffff7d4);
  if (iVar1 == 0) {
    amrex::OpenMP::get_thread_num();
    amrex::sundials::The_Sundials_Context(0);
    sundials::Context::operator_cast_to__SUNContext_((Context *)0x1c55b2);
    pvVar7 = CVodeCreate(in_stack_fffffffffffff7dc,
                         (SUNContext)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0));
    this->cvode_mem = pvVar7;
    iVar1 = utils::check_flag((void *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0),
                              (char *)CONCAT44(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8),
                              in_stack_fffffffffffff7d4);
    if (iVar1 == 0) {
      pCVar8 = (CVODEUserData *)operator_new(0xd8);
      pCVar8->dt_save = 0.0;
      pCVar8->ncells = 0;
      pCVar8->verbose = 0;
      pCVar8->maxOrder = 0;
      pCVar8->reactor_type = 0;
      pCVar8->analytical_jacobian = 0;
      pCVar8->solve_type = 0;
      pCVar8->precond_type = 0;
      pCVar8->NNZ = 0;
      pCVar8->rhoe_init = (Real *)0x0;
      pCVar8->rhoesrc_ext = (Real *)0x0;
      pCVar8->rYsrc_ext = (Real *)0x0;
      pCVar8->mask = (int *)0x0;
      pCVar8->FCunt = (int *)0x0;
      pCVar8->gamma = 0.0;
      pCVar8->nbBlocks = 0;
      pCVar8->nbThreads = 0;
      pCVar8->FirstTimePrecond = false;
      pCVar8->Jdata = (Real **)0x0;
      pCVar8->PS = (SUNMatrix *)0x0;
      pCVar8->rowVals = (int **)0x0;
      pCVar8->rowPtrs = (int **)0x0;
      pCVar8->colPtrs = (int **)0x0;
      pCVar8->colVals = (int **)0x0;
      pCVar8->indx = (int *)0x0;
      pCVar8->JSPSmat = (Real **)0x0;
      pCVar8->Jbd = (Real ****)0x0;
      pCVar8->P = (Real ****)0x0;
      pCVar8->pivot = (sunindextype ***)0x0;
      pCVar8->PSc = (SUNMatrix)0x0;
      pCVar8->colVals_c = (int *)0x0;
      pCVar8->rowPtrs_c = (int *)0x0;
      this->udata_g = pCVar8;
      allocUserData(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb4);
      iVar1 = utils::check_flag((void *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0
                                                ),
                                (char *)CONCAT44(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8
                                                ),in_stack_fffffffffffff7d4);
      if (iVar1 == 0) {
        local_56c = CVodeSetUserData((void *)CONCAT44(in_stack_fffffffffffff7dc,
                                                      in_stack_fffffffffffff7d8),
                                     (void *)CONCAT44(in_stack_fffffffffffff7d4,
                                                      in_stack_fffffffffffff7d0));
        iVar1 = utils::check_flag((void *)CONCAT44(in_stack_fffffffffffff7e4,
                                                   in_stack_fffffffffffff7e0),
                                  (char *)CONCAT44(in_stack_fffffffffffff7dc,
                                                   in_stack_fffffffffffff7d8),
                                  in_stack_fffffffffffff7d4);
        if (iVar1 == 0) {
          local_578 = 0;
          local_56c = CVodeInit((void *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808
                                                ),
                                (CVRhsFn)CONCAT44(in_stack_fffffffffffff804,
                                                  in_stack_fffffffffffff800),
                                (realtype)
                                CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8),
                                (N_Vector)
                                CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0));
          iVar1 = utils::check_flag((void *)CONCAT44(in_stack_fffffffffffff7e4,
                                                     in_stack_fffffffffffff7e0),
                                    (char *)CONCAT44(in_stack_fffffffffffff7dc,
                                                     in_stack_fffffffffffff7d8),
                                    in_stack_fffffffffffff7d4);
          if (iVar1 == 0) {
            amrex::OpenMP::get_thread_num();
            amrex::sundials::The_Sundials_Context(0);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_598,"cvode",&local_599);
            ReactorBase::set_sundials_solver_tols
                      ((ReactorBase *)in_stack_fffffffffffffbc0,(Context *)in_stack_fffffffffffffbb8
                       ,(void *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                       in_stack_fffffffffffffbac,in_stack_fffffffffffffba0,in_stack_fffffffffffffb98
                       ,in_stack_fffffffffffffb90);
            std::__cxx11::string::~string(local_598);
            std::allocator<char>::~allocator((allocator<char> *)&local_599);
            if (this->udata_g->solve_type == 0) {
              amrex::OpenMP::get_thread_num();
              amrex::sundials::The_Sundials_Context(0);
              sundials::Context::operator_cast_to__SUNContext_((Context *)0x1c5a4b);
              p_Var9 = SUNNonlinSol_FixedPoint
                                 ((N_Vector)
                                  CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8),
                                  in_stack_fffffffffffff7e4,
                                  (SUNContext)
                                  CONCAT44(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8));
              this->NLS = p_Var9;
              iVar1 = utils::check_flag((void *)CONCAT44(in_stack_fffffffffffff7e4,
                                                         in_stack_fffffffffffff7e0),
                                        (char *)CONCAT44(in_stack_fffffffffffff7dc,
                                                         in_stack_fffffffffffff7d8),
                                        in_stack_fffffffffffff7d4);
              if (iVar1 != 0) {
                local_24 = 1;
                goto LAB_001c6a66;
              }
              local_56c = CVodeSetNonlinearSolver
                                    ((void *)CONCAT44(in_stack_fffffffffffff7dc,
                                                      in_stack_fffffffffffff7d8),
                                     (SUNNonlinearSolver)
                                     CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0));
              iVar1 = utils::check_flag((void *)CONCAT44(in_stack_fffffffffffff7e4,
                                                         in_stack_fffffffffffff7e0),
                                        (char *)CONCAT44(in_stack_fffffffffffff7dc,
                                                         in_stack_fffffffffffff7d8),
                                        in_stack_fffffffffffff7d4);
              if (iVar1 != 0) {
                local_24 = 1;
                goto LAB_001c6a66;
              }
            }
            else if ((this->udata_g->solve_type == 1) || (this->udata_g->solve_type == 2)) {
              amrex::OpenMP::get_thread_num();
              amrex::sundials::The_Sundials_Context(0);
              sundials::Context::operator_cast_to__SUNContext_((Context *)0x1c5c14);
              p_Var10 = SUNDenseMatrix(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8,
                                       (SUNContext)
                                       CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0)
                                      );
              this->A = p_Var10;
              iVar1 = utils::check_flag((void *)CONCAT44(in_stack_fffffffffffff7e4,
                                                         in_stack_fffffffffffff7e0),
                                        (char *)CONCAT44(in_stack_fffffffffffff7dc,
                                                         in_stack_fffffffffffff7d8),
                                        in_stack_fffffffffffff7d4);
              if (iVar1 != 0) {
                local_24 = 1;
                goto LAB_001c6a66;
              }
              amrex::OpenMP::get_thread_num();
              amrex::sundials::The_Sundials_Context(0);
              sundials::Context::operator_cast_to__SUNContext_((Context *)0x1c5cf6);
              p_Var11 = SUNLinSol_Dense((N_Vector)
                                        CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8
                                                ),
                                        (SUNMatrix)
                                        CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0
                                                ),
                                        (SUNContext)
                                        CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8
                                                ));
              this->LS = p_Var11;
              iVar1 = utils::check_flag((void *)CONCAT44(in_stack_fffffffffffff7e4,
                                                         in_stack_fffffffffffff7e0),
                                        (char *)CONCAT44(in_stack_fffffffffffff7dc,
                                                         in_stack_fffffffffffff7d8),
                                        in_stack_fffffffffffff7d4);
              if (iVar1 != 0) {
                local_24 = 1;
                goto LAB_001c6a66;
              }
              local_56c = CVodeSetLinearSolver
                                    ((void *)CONCAT44(in_stack_fffffffffffff80c,
                                                      in_stack_fffffffffffff808),
                                     (SUNLinearSolver)
                                     CONCAT44(in_stack_fffffffffffff804,in_stack_fffffffffffff800),
                                     (SUNMatrix)
                                     CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8));
              iVar1 = utils::check_flag((void *)CONCAT44(in_stack_fffffffffffff7e4,
                                                         in_stack_fffffffffffff7e0),
                                        (char *)CONCAT44(in_stack_fffffffffffff7dc,
                                                         in_stack_fffffffffffff7d8),
                                        in_stack_fffffffffffff7d4);
              if (iVar1 != 0) {
                local_24 = 1;
                goto LAB_001c6a66;
              }
            }
            else if (this->udata_g->solve_type == 3) {
              local_8 = "sparseDirect solver_type not valid without KLU library.";
              amrex::Abort_host((char *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0
                                                ));
            }
            else if (this->udata_g->solve_type == 4) {
              amrex::OpenMP::get_thread_num();
              amrex::sundials::The_Sundials_Context(0);
              sundials::Context::operator_cast_to__SUNContext_((Context *)0x1c5ec2);
              p_Var10 = SUNSparseMatrix(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8,
                                        in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0,
                                        (SUNContext)
                                        CONCAT44(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8
                                                ));
              this->A = p_Var10;
              iVar1 = utils::check_flag((void *)CONCAT44(in_stack_fffffffffffff7e4,
                                                         in_stack_fffffffffffff7e0),
                                        (char *)CONCAT44(in_stack_fffffffffffff7dc,
                                                         in_stack_fffffffffffff7d8),
                                        in_stack_fffffffffffff7d4);
              if (iVar1 != 0) {
                local_24 = 1;
                goto LAB_001c6a66;
              }
              amrex::OpenMP::get_thread_num();
              amrex::sundials::The_Sundials_Context(0);
              in_stack_fffffffffffff7c8 =
                   sundials::Context::operator_cast_to__SUNContext_((Context *)0x1c5fd9);
              p_Var11 = cvode::SUNLinSol_sparse_custom
                                  ((N_Vector)
                                   CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8),
                                   (SUNMatrix)
                                   CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0),
                                   in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8,
                                   in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0,
                                   (SUNContext)
                                   CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810));
              this->LS = p_Var11;
              iVar1 = utils::check_flag((void *)CONCAT44(in_stack_fffffffffffff7e4,
                                                         in_stack_fffffffffffff7e0),
                                        (char *)CONCAT44(in_stack_fffffffffffff7dc,
                                                         in_stack_fffffffffffff7d8),
                                        in_stack_fffffffffffff7d4);
              if (iVar1 != 0) {
                local_24 = 1;
                goto LAB_001c6a66;
              }
              local_56c = CVodeSetLinearSolver
                                    ((void *)CONCAT44(in_stack_fffffffffffff80c,
                                                      in_stack_fffffffffffff808),
                                     (SUNLinearSolver)
                                     CONCAT44(in_stack_fffffffffffff804,in_stack_fffffffffffff800),
                                     (SUNMatrix)
                                     CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8));
              iVar1 = utils::check_flag((void *)CONCAT44(in_stack_fffffffffffff7e4,
                                                         in_stack_fffffffffffff7e0),
                                        (char *)CONCAT44(in_stack_fffffffffffff7dc,
                                                         in_stack_fffffffffffff7d8),
                                        in_stack_fffffffffffff7d4);
              if (iVar1 != 0) {
                local_24 = 1;
                goto LAB_001c6a66;
              }
            }
            else if (this->udata_g->solve_type == 5) {
              amrex::OpenMP::get_thread_num();
              amrex::sundials::The_Sundials_Context(0);
              sundials::Context::operator_cast_to__SUNContext_((Context *)0x1c6170);
              p_Var11 = SUNLinSol_SPGMR((N_Vector)
                                        CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8
                                                ),in_stack_fffffffffffff7e4,
                                        in_stack_fffffffffffff7e0,
                                        (SUNContext)
                                        CONCAT44(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8
                                                ));
              this->LS = p_Var11;
              iVar1 = utils::check_flag((void *)CONCAT44(in_stack_fffffffffffff7e4,
                                                         in_stack_fffffffffffff7e0),
                                        (char *)CONCAT44(in_stack_fffffffffffff7dc,
                                                         in_stack_fffffffffffff7d8),
                                        in_stack_fffffffffffff7d4);
              if (iVar1 != 0) {
                local_24 = 1;
                goto LAB_001c6a66;
              }
              local_56c = CVodeSetLinearSolver
                                    ((void *)CONCAT44(in_stack_fffffffffffff80c,
                                                      in_stack_fffffffffffff808),
                                     (SUNLinearSolver)
                                     CONCAT44(in_stack_fffffffffffff804,in_stack_fffffffffffff800),
                                     (SUNMatrix)
                                     CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8));
              iVar1 = utils::check_flag((void *)CONCAT44(in_stack_fffffffffffff7e4,
                                                         in_stack_fffffffffffff7e0),
                                        (char *)CONCAT44(in_stack_fffffffffffff7dc,
                                                         in_stack_fffffffffffff7d8),
                                        in_stack_fffffffffffff7d4);
              if (iVar1 != 0) {
                local_24 = 1;
                goto LAB_001c6a66;
              }
            }
            else if (this->udata_g->solve_type == 6) {
              amrex::OpenMP::get_thread_num();
              amrex::sundials::The_Sundials_Context(0);
              sundials::Context::operator_cast_to__SUNContext_((Context *)0x1c62de);
              p_Var11 = SUNLinSol_SPGMR((N_Vector)
                                        CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8
                                                ),in_stack_fffffffffffff7e4,
                                        in_stack_fffffffffffff7e0,
                                        (SUNContext)
                                        CONCAT44(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8
                                                ));
              this->LS = p_Var11;
              iVar1 = utils::check_flag((void *)CONCAT44(in_stack_fffffffffffff7e4,
                                                         in_stack_fffffffffffff7e0),
                                        (char *)CONCAT44(in_stack_fffffffffffff7dc,
                                                         in_stack_fffffffffffff7d8),
                                        in_stack_fffffffffffff7d4);
              if (iVar1 != 0) {
                local_24 = 1;
                goto LAB_001c6a66;
              }
              local_56c = CVodeSetLinearSolver
                                    ((void *)CONCAT44(in_stack_fffffffffffff80c,
                                                      in_stack_fffffffffffff808),
                                     (SUNLinearSolver)
                                     CONCAT44(in_stack_fffffffffffff804,in_stack_fffffffffffff800),
                                     (SUNMatrix)
                                     CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8));
              iVar1 = utils::check_flag((void *)CONCAT44(in_stack_fffffffffffff7e4,
                                                         in_stack_fffffffffffff7e0),
                                        (char *)CONCAT44(in_stack_fffffffffffff7dc,
                                                         in_stack_fffffffffffff7d8),
                                        in_stack_fffffffffffff7d4);
              if (iVar1 != 0) {
                local_24 = 1;
                goto LAB_001c6a66;
              }
            }
            else {
              local_10 = "Wrong choice of linear solver...";
              amrex::Abort_host((char *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0
                                                ));
            }
            if (this->udata_g->analytical_jacobian == 1) {
              if (this->udata_g->solve_type == 2) {
                local_56c = CVodeSetJacFn((void *)CONCAT44(in_stack_fffffffffffff7ec,
                                                           in_stack_fffffffffffff7e8),
                                          (CVLsJacFn)
                                          CONCAT44(in_stack_fffffffffffff7e4,
                                                   in_stack_fffffffffffff7e0));
                iVar1 = utils::check_flag((void *)CONCAT44(in_stack_fffffffffffff7e4,
                                                           in_stack_fffffffffffff7e0),
                                          (char *)CONCAT44(in_stack_fffffffffffff7dc,
                                                           in_stack_fffffffffffff7d8),
                                          in_stack_fffffffffffff7d4);
                if (iVar1 != 0) {
                  local_24 = 1;
                  goto LAB_001c6a66;
                }
              }
              else if (this->udata_g->solve_type == 3) {
                local_18 = 
                "Shouldn\'t be there: sparseDirect solver_type not valid without KLU library.";
                amrex::Abort_host((char *)CONCAT44(in_stack_fffffffffffff7e4,
                                                   in_stack_fffffffffffff7e0));
              }
              else if (this->udata_g->solve_type == 4) {
                local_56c = CVodeSetJacFn((void *)CONCAT44(in_stack_fffffffffffff7ec,
                                                           in_stack_fffffffffffff7e8),
                                          (CVLsJacFn)
                                          CONCAT44(in_stack_fffffffffffff7e4,
                                                   in_stack_fffffffffffff7e0));
                iVar1 = utils::check_flag((void *)CONCAT44(in_stack_fffffffffffff7e4,
                                                           in_stack_fffffffffffff7e0),
                                          (char *)CONCAT44(in_stack_fffffffffffff7dc,
                                                           in_stack_fffffffffffff7d8),
                                          in_stack_fffffffffffff7d4);
                if (iVar1 != 0) {
                  local_24 = 1;
                  goto LAB_001c6a66;
                }
              }
            }
            if (this->udata_g->precond_type == 0) {
              local_56c = CVodeSetJacTimes((void *)CONCAT44(in_stack_fffffffffffff7ec,
                                                            in_stack_fffffffffffff7e8),
                                           (CVLsJacTimesSetupFn)
                                           CONCAT44(in_stack_fffffffffffff7e4,
                                                    in_stack_fffffffffffff7e0),
                                           (CVLsJacTimesVecFn)
                                           CONCAT44(in_stack_fffffffffffff7dc,
                                                    in_stack_fffffffffffff7d8));
              iVar1 = utils::check_flag((void *)CONCAT44(in_stack_fffffffffffff7e4,
                                                         in_stack_fffffffffffff7e0),
                                        (char *)CONCAT44(in_stack_fffffffffffff7dc,
                                                         in_stack_fffffffffffff7d8),
                                        in_stack_fffffffffffff7d4);
              if (iVar1 != 0) {
                local_24 = 1;
                goto LAB_001c6a66;
              }
              local_56c = CVodeSetPreconditioner
                                    ((void *)CONCAT44(in_stack_fffffffffffff7fc,
                                                      in_stack_fffffffffffff7f8),
                                     (CVLsPrecSetupFn)
                                     CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0),
                                     (CVLsPrecSolveFn)
                                     CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
              iVar1 = utils::check_flag((void *)CONCAT44(in_stack_fffffffffffff7e4,
                                                         in_stack_fffffffffffff7e0),
                                        (char *)CONCAT44(in_stack_fffffffffffff7dc,
                                                         in_stack_fffffffffffff7d8),
                                        in_stack_fffffffffffff7d4);
              if (iVar1 != 0) {
                local_24 = 1;
                goto LAB_001c6a66;
              }
            }
            else if (this->udata_g->precond_type == 1) {
              local_20 = "sparseSimpleAJac precond_type not valid without KLU library.";
              amrex::Abort_host((char *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0
                                                ));
            }
            else if (this->udata_g->precond_type == 2) {
              local_56c = CVodeSetJacTimes((void *)CONCAT44(in_stack_fffffffffffff7ec,
                                                            in_stack_fffffffffffff7e8),
                                           (CVLsJacTimesSetupFn)
                                           CONCAT44(in_stack_fffffffffffff7e4,
                                                    in_stack_fffffffffffff7e0),
                                           (CVLsJacTimesVecFn)
                                           CONCAT44(in_stack_fffffffffffff7dc,
                                                    in_stack_fffffffffffff7d8));
              iVar1 = utils::check_flag((void *)CONCAT44(in_stack_fffffffffffff7e4,
                                                         in_stack_fffffffffffff7e0),
                                        (char *)CONCAT44(in_stack_fffffffffffff7dc,
                                                         in_stack_fffffffffffff7d8),
                                        in_stack_fffffffffffff7d4);
              if (iVar1 != 0) {
                local_24 = 1;
                goto LAB_001c6a66;
              }
              local_56c = CVodeSetPreconditioner
                                    ((void *)CONCAT44(in_stack_fffffffffffff7fc,
                                                      in_stack_fffffffffffff7f8),
                                     (CVLsPrecSetupFn)
                                     CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0),
                                     (CVLsPrecSolveFn)
                                     CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
              iVar1 = utils::check_flag((void *)CONCAT44(in_stack_fffffffffffff7e4,
                                                         in_stack_fffffffffffff7e0),
                                        (char *)CONCAT44(in_stack_fffffffffffff7dc,
                                                         in_stack_fffffffffffff7d8),
                                        in_stack_fffffffffffff7d4);
              if (iVar1 != 0) {
                local_24 = 1;
                goto LAB_001c6a66;
              }
            }
            local_56c = CVodeSetMaxNonlinIters
                                  ((void *)CONCAT44(in_stack_fffffffffffff7dc,
                                                    in_stack_fffffffffffff7d8),
                                   in_stack_fffffffffffff7d4);
            iVar1 = utils::check_flag((void *)CONCAT44(in_stack_fffffffffffff7e4,
                                                       in_stack_fffffffffffff7e0),
                                      (char *)CONCAT44(in_stack_fffffffffffff7dc,
                                                       in_stack_fffffffffffff7d8),
                                      in_stack_fffffffffffff7d4);
            if (iVar1 == 0) {
              local_56c = CVodeSetMaxErrTestFails
                                    ((void *)CONCAT44(in_stack_fffffffffffff7dc,
                                                      in_stack_fffffffffffff7d8),
                                     in_stack_fffffffffffff7d4);
              iVar1 = utils::check_flag((void *)CONCAT44(in_stack_fffffffffffff7e4,
                                                         in_stack_fffffffffffff7e0),
                                        (char *)CONCAT44(in_stack_fffffffffffff7dc,
                                                         in_stack_fffffffffffff7d8),
                                        in_stack_fffffffffffff7d4);
              if (iVar1 == 0) {
                local_56c = CVodeSetErrHandlerFn
                                      ((void *)CONCAT44(in_stack_fffffffffffff7dc,
                                                        in_stack_fffffffffffff7d8),
                                       (CVErrHandlerFn)
                                       CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0)
                                       ,in_stack_fffffffffffff7c8);
                iVar1 = utils::check_flag((void *)CONCAT44(in_stack_fffffffffffff7e4,
                                                           in_stack_fffffffffffff7e0),
                                          (char *)CONCAT44(in_stack_fffffffffffff7dc,
                                                           in_stack_fffffffffffff7d8),
                                          in_stack_fffffffffffff7d4);
                if (iVar1 == 0) {
                  iVar2 = CVodeSetMaxNumSteps((void *)CONCAT44(in_stack_fffffffffffff7dc,
                                                               in_stack_fffffffffffff7d8),
                                              CONCAT44(in_stack_fffffffffffff7d4,
                                                       in_stack_fffffffffffff7d0));
                  local_56c = iVar2;
                  iVar3 = utils::check_flag((void *)CONCAT44(in_stack_fffffffffffff7e4,
                                                             in_stack_fffffffffffff7e0),
                                            (char *)CONCAT44(in_stack_fffffffffffff7dc,
                                                             in_stack_fffffffffffff7d8),
                                            in_stack_fffffffffffff7d4);
                  if (iVar3 == 0) {
                    iVar4 = CVodeSetMaxOrd((void *)CONCAT44(in_stack_fffffffffffff7dc,
                                                            in_stack_fffffffffffff7d8),
                                           in_stack_fffffffffffff7d4);
                    local_56c = iVar4;
                    iVar5 = utils::check_flag((void *)CONCAT44(iVar3,iVar4),
                                              (char *)CONCAT44(in_stack_fffffffffffff7dc,
                                                               in_stack_fffffffffffff7d8),
                                              in_stack_fffffffffffff7d4);
                    if (iVar5 == 0) {
                      if (this->LS != (SUNLinearSolver)0x0) {
                        local_56c = CVodeSetJacEvalFrequency
                                              ((void *)CONCAT44(iVar1,iVar2),CONCAT44(iVar3,iVar4));
                        iVar1 = utils::check_flag((void *)CONCAT44(iVar3,iVar4),
                                                  (char *)CONCAT44(iVar5,local_56c),
                                                  in_stack_fffffffffffff7d4);
                        if (iVar1 != 0) {
                          local_24 = 1;
                          goto LAB_001c6a66;
                        }
                      }
                      local_24 = 0;
                    }
                    else {
                      local_24 = 1;
                    }
                  }
                  else {
                    local_24 = 1;
                  }
                }
                else {
                  local_24 = 1;
                }
              }
              else {
                local_24 = 1;
              }
            }
            else {
              local_24 = 1;
            }
          }
          else {
            local_24 = 1;
          }
        }
        else {
          local_24 = 1;
        }
      }
      else {
        local_24 = 1;
      }
    }
    else {
      local_24 = 1;
    }
  }
  else {
    local_24 = 1;
  }
LAB_001c6a66:
  local_568 = 1;
  amrex::ParmParse::~ParmParse((ParmParse *)0x1c6a73);
  return local_24;
}

Assistant:

int
ReactorCvode::init(int reactor_type, int ncells)
{
  BL_PROFILE("Pele::ReactorCvode::init()");
  m_reactor_type = reactor_type;
  ReactorTypes::check_reactor_type(m_reactor_type);
  amrex::ParmParse pp("ode");
  pp.query("verbose", verbose);
  pp.query("rtol", relTol);
  pp.query("atol", absTol);
  pp.query("atomic_reductions", atomic_reductions);
  pp.query("max_nls_iters", max_nls_iters);
  pp.query("max_fp_accel", max_fp_accel);
  pp.query("clean_init_massfrac", m_clean_init_massfrac);
  checkCvodeOptions();

  amrex::Print() << "Initializing CVODE:\n";

  if (atomic_reductions != 0) {
    amrex::Print() << "  Using atomic reductions\n";
  } else {
    amrex::Print() << "  Using LDS reductions\n";
  }

#ifndef AMREX_USE_GPU
  // ----------------------------------------------------------
  // On CPU, initialize cvode_mem/userData
  // ----------------------------------------------------------

  // Solution vector
  int neq_tot = (NUM_SPECIES + 1) * ncells;
  y = N_VNew_Serial(neq_tot, *amrex::sundials::The_Sundials_Context());
  if (utils::check_flag(static_cast<void*>(y), "N_VNew_Serial", 0) != 0) {
    return (1);
  }

  // Call CVodeCreate to create the solver memory and specify the Backward
  // Differentiation Formula and the use of a Newton iteration
  cvode_mem = CVodeCreate(CV_BDF, *amrex::sundials::The_Sundials_Context());
  if (utils::check_flag(static_cast<void*>(cvode_mem), "CVodeCreate", 0) != 0) {
    return (1);
  }

  udata_g = new CVODEUserData{};
  allocUserData(udata_g, ncells);
  if (utils::check_flag(static_cast<void*>(udata_g), "allocUserData", 2) != 0) {
    return (1);
  }

  // Set the pointer to user-defined data
  int flag = CVodeSetUserData(cvode_mem, udata_g);
  if (utils::check_flag(&flag, "CVodeSetUserData", 1) != 0) {
    return (1);
  }

  // Call CVodeInit to initialize the integrator memory and specify the user's
  // right hand side function, the inital time, and initial dependent variable
  // vector y.
  amrex::Real time = 0.0;
  flag = CVodeInit(cvode_mem, cF_RHS, time, y);
  if (utils::check_flag(&flag, "CVodeInit", 1) != 0) {
    return (1);
  }

  // Setup tolerances
  set_sundials_solver_tols(
    *amrex::sundials::The_Sundials_Context(), cvode_mem, udata_g->ncells,
    relTol, absTol, "cvode");

  // Linear solver data
  if (udata_g->solve_type == cvode::fixedPoint) {
    NLS = SUNNonlinSol_FixedPoint(
      y, max_fp_accel, *amrex::sundials::The_Sundials_Context());
    if (utils::check_flag(
          static_cast<void*>(NLS), "SUNNonlinSol_FixedPoint", 0)) {
      return (1);
    }

    flag = CVodeSetNonlinearSolver(cvode_mem, NLS);
    if (utils::check_flag(&flag, "CVodeSetNonlinearSolver", 1)) {
      return (1);
    }

  } else if (
    udata_g->solve_type == cvode::denseFDDirect ||
    udata_g->solve_type == cvode::denseDirect) {
    // Create dense SUNMatrix for use in linear solves
    A = SUNDenseMatrix(
      neq_tot, neq_tot, *amrex::sundials::The_Sundials_Context());
    if (utils::check_flag(static_cast<void*>(A), "SUNDenseMatrix", 0) != 0) {
      return (1);
    }

    // Create dense SUNLinearSolver object for use by CVode
    LS = SUNLinSol_Dense(y, A, *amrex::sundials::The_Sundials_Context());
    if (utils::check_flag(static_cast<void*>(LS), "SUNLinSol_Dense", 0) != 0) {
      return (1);
    }

    // Call CVodeSetLinearSolver to attach the matrix and linear solver to CVode
    flag = CVodeSetLinearSolver(cvode_mem, LS, A);
    if (utils::check_flag(&flag, "CVodeSetLinearSolver", 1) != 0) {
      return (1);
    }

  } else if (udata_g->solve_type == cvode::sparseDirect) {
#ifdef PELE_USE_KLU
    // Create sparse SUNMatrix for use in linear solves
    A = SUNSparseMatrix(
      neq_tot, neq_tot, (udata_g->NNZ) * udata_g->ncells, CSC_MAT,
      *amrex::sundials::The_Sundials_Context());
    if (utils::check_flag(static_cast<void*>(A), "SUNSparseMatrix", 0))
      return (1);

    // Create KLU solver object for use by CVode
    LS = SUNLinSol_KLU(y, A, *amrex::sundials::The_Sundials_Context());
    if (utils::check_flag(static_cast<void*>(LS), "SUNLinSol_KLU", 0))
      return (1);

    // Call CVodeSetLinearSolver to attach the matrix and linear solver to CVode
    flag = CVodeSetLinearSolver(cvode_mem, LS, A);
    if (utils::check_flag(&flag, "CVodeSetLinearSolver", 1))
      return (1);
#else
    amrex::Abort("sparseDirect solver_type not valid without KLU library.");
#endif

  } else if (udata_g->solve_type == cvode::customDirect) {
    // Create dense SUNMatrix for use in linear solves
    A = SUNSparseMatrix(
      neq_tot, neq_tot, (udata_g->NNZ) * udata_g->ncells, CSR_MAT,
      *amrex::sundials::The_Sundials_Context());
    if (utils::check_flag(static_cast<void*>(A), "SUNDenseMatrix", 0) != 0) {
      return (1);
    }

    // Create dense SUNLinearSolver object for use by CVode
    LS = cvode::SUNLinSol_sparse_custom(
      y, A, reactor_type, udata_g->ncells, (NUM_SPECIES + 1), udata_g->NNZ,
      *amrex::sundials::The_Sundials_Context());
    if (
      utils::check_flag(static_cast<void*>(LS), "SUNLinSol_sparse_custom", 0) !=
      0) {
      return (1);
    }

    // Call CVodeSetLinearSolver to attach the matrix and linear solver to CVode
    flag = CVodeSetLinearSolver(cvode_mem, LS, A);
    if (utils::check_flag(&flag, "CVodeSetLinearSolver", 1) != 0) {
      return (1);
    }

  } else if (udata_g->solve_type == cvode::GMRES) {
    // Create the GMRES linear solver object
    LS = SUNLinSol_SPGMR(
      y, SUN_PREC_NONE, 0, *amrex::sundials::The_Sundials_Context());
    if (utils::check_flag(static_cast<void*>(LS), "SUNLinSol_SPGMR", 0) != 0) {
      return (1);
    }

    // Set CVode linear solver to LS
    flag = CVodeSetLinearSolver(cvode_mem, LS, nullptr);
    if (utils::check_flag(&flag, "CVodeSetLinearSolver", 1) != 0) {
      return (1);
    }

  } else if (udata_g->solve_type == cvode::precGMRES) {
    // Create the GMRES linear solver object
    LS = SUNLinSol_SPGMR(
      y, SUN_PREC_LEFT, 0, *amrex::sundials::The_Sundials_Context());
    if (utils::check_flag(static_cast<void*>(LS), "SUNLinSol_SPGMR", 0) != 0) {
      return (1);
    }

    // Set CVode linear solver to LS
    flag = CVodeSetLinearSolver(cvode_mem, LS, nullptr);
    if (utils::check_flag(&flag, "CVodeSetLinearSolver", 1) != 0) {
      return (1);
    }

  } else {
    amrex::Abort("Wrong choice of linear solver...");
  }

  // Analytical Jac. data for direct solver
  if (udata_g->analytical_jacobian == 1) {
    if (udata_g->solve_type == cvode::denseDirect) {
      // Set the user-supplied Jacobian routine Jac
      flag = CVodeSetJacFn(cvode_mem, cvode::cJac);
      if (utils::check_flag(&flag, "CVodeSetJacFn", 1) != 0) {
        return (1);
      }
    } else if (udata_g->solve_type == cvode::sparseDirect) {
#ifdef PELE_USE_KLU
      // Set the user-supplied KLU Jacobian routine Jac
      flag = CVodeSetJacFn(cvode_mem, cvode::cJac_KLU);
      if (utils::check_flag(&flag, "CVodeSetJacFn", 1))
        return (1);
#else
      amrex::Abort(
        "Shouldn't be there: sparseDirect solver_type not valid without "
        "KLU library.");
#endif
    } else if (udata_g->solve_type == cvode::customDirect) {
      // Set the user-supplied Jacobian routine Jac
      flag = CVodeSetJacFn(cvode_mem, cvode::cJac_sps);
      if (utils::check_flag(&flag, "CVodeSetJacFn", 1) != 0) {
        return (1);
      }
    }
  }

  // Analytical Jac. data for iterative solver preconditioner
  if (udata_g->precond_type == cvode::denseSimpleAJac) {
    // Set the JAcobian-times-vector function
    flag = CVodeSetJacTimes(cvode_mem, nullptr, nullptr);
    if (utils::check_flag(&flag, "CVodeSetJacTimes", 1) != 0) {
      return (1);
    }
    // Set the preconditioner plain dense solve and setup functions
    flag = CVodeSetPreconditioner(cvode_mem, cvode::Precond, cvode::PSolve);
    if (utils::check_flag(&flag, "CVodeSetPreconditioner", 1) != 0) {
      return (1);
    }
  } else if (udata_g->precond_type == cvode::sparseSimpleAJac) {
#ifdef PELE_USE_KLU
    // Set the JAcobian-times-vector function
    flag = CVodeSetJacTimes(cvode_mem, nullptr, nullptr);
    if (utils::check_flag(&flag, "CVodeSetJacTimes", 1))
      return (1);
    // Set the preconditioner KLU sparse solve and setup functions
    flag = CVodeSetPreconditioner(
      cvode_mem, cvode::Precond_sparse, cvode::PSolve_sparse);
    if (utils::check_flag(&flag, "CVodeSetPreconditioner", 1))
      return (1);
#else
    amrex::Abort(
      "sparseSimpleAJac precond_type not valid without KLU library.");
#endif
  } else if (udata_g->precond_type == cvode::customSimpleAJac) {
    // Set the JAcobian-times-vector function
    flag = CVodeSetJacTimes(cvode_mem, nullptr, nullptr);
    if (utils::check_flag(&flag, "CVodeSetJacTimes", 1) != 0) {
      return (1);
    }
    // Set the preconditioner to custom solve and setup functions
    flag = CVodeSetPreconditioner(
      cvode_mem, cvode::Precond_custom, cvode::PSolve_custom);
    if (utils::check_flag(&flag, "CVodeSetPreconditioner", 1) != 0) {
      return (1);
    }
  }

  // CVODE runtime options
  flag = CVodeSetMaxNonlinIters(cvode_mem, max_nls_iters); // Max newton iter.
  if (utils::check_flag(&flag, "CVodeSetMaxNonlinIters", 1) != 0) {
    return (1);
  }
  flag = CVodeSetMaxErrTestFails(cvode_mem, 100); // Max Err.test failure
  if (utils::check_flag(&flag, "CVodeSetMaxErrTestFails", 1) != 0) {
    return (1);
  }
  flag = CVodeSetErrHandlerFn(
    cvode_mem, cvode::cvodeErrHandler, nullptr); // Err. handler funct.
  if (utils::check_flag(&flag, "CVodeSetErrHandlerFn", 1) != 0) {
    return (1);
  }
  flag = CVodeSetMaxNumSteps(cvode_mem, 10000); // Max substeps
  if (utils::check_flag(&flag, "CVodeSetMaxNumSteps", 1) != 0) {
    return (1);
  }
  flag = CVodeSetMaxOrd(cvode_mem, udata_g->maxOrder); // Max order
  if (utils::check_flag(&flag, "CVodeSetMaxOrd", 1) != 0) {
    return (1);
  }
  if (LS != nullptr) {
    flag = CVodeSetJacEvalFrequency(cvode_mem, 100); // Max Jac age
    if (utils::check_flag(&flag, "CVodeSetJacEvalFrequency", 1) != 0) {
      return (1);
    }
  }

  // End of CPU section
#endif

  return (0);
}